

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O2

void __thiscall
Diligent::DynamicHeap::MasterBlockListBasedManager::~MasterBlockListBasedManager
          (MasterBlockListBasedManager *this)

{
  char (*in_RCX) [55];
  string msg;
  
  if ((this->m_MasterBlockCounter).super___atomic_base<int>._M_i != 0) {
    FormatString<std::atomic<int>,char[55]>
              (&msg,(Diligent *)&this->m_MasterBlockCounter,
               (atomic<int> *)" master block(s) have not been returned to the manager",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~MasterBlockListBasedManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/DynamicHeap.hpp"
               ,0x7a);
    std::__cxx11::string::~string((string *)&msg);
  }
  VariableSizeAllocationsManager::~VariableSizeAllocationsManager(&this->m_AllocationsMgr);
  return;
}

Assistant:

~MasterBlockListBasedManager()
    {
        DEV_CHECK_ERR(m_MasterBlockCounter == 0, m_MasterBlockCounter, " master block(s) have not been returned to the manager");
    }